

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::init_progressive(jpeg_decoder *this)

{
  bool bVar1;
  int iVar2;
  coeff_buf *pcVar3;
  bool bVar4;
  pDecode_block_func local_30;
  pDecode_block_func decode_block_func;
  int refinement_scan;
  int dc_only_scan;
  uint32_t MAX_SCANS_TO_PROCESS;
  uint32_t total_scans;
  int i;
  jpeg_decoder *this_local;
  
  if (this->m_comps_in_frame == 4) {
    stop_decoding(this,JPGD_UNSUPPORTED_COLORSPACE);
  }
  for (MAX_SCANS_TO_PROCESS = 0; (int)MAX_SCANS_TO_PROCESS < this->m_comps_in_frame;
      MAX_SCANS_TO_PROCESS = MAX_SCANS_TO_PROCESS + 1) {
    pcVar3 = coeff_buf_open(this,this->m_max_mcus_per_row *
                                 this->m_comp_h_samp[(int)MAX_SCANS_TO_PROCESS],
                            this->m_max_mcus_per_col *
                            this->m_comp_v_samp[(int)MAX_SCANS_TO_PROCESS],1,1);
    this->m_dc_coeffs[(int)MAX_SCANS_TO_PROCESS] = pcVar3;
    pcVar3 = coeff_buf_open(this,this->m_max_mcus_per_row *
                                 this->m_comp_h_samp[(int)MAX_SCANS_TO_PROCESS],
                            this->m_max_mcus_per_col *
                            this->m_comp_v_samp[(int)MAX_SCANS_TO_PROCESS],8,8);
    this->m_ac_coeffs[(int)MAX_SCANS_TO_PROCESS] = pcVar3;
  }
  dc_only_scan = 0;
  while( true ) {
    iVar2 = init_scan(this);
    if (iVar2 == 0) {
      this->m_comps_in_scan = this->m_comps_in_frame;
      for (MAX_SCANS_TO_PROCESS = 0; (int)MAX_SCANS_TO_PROCESS < this->m_comps_in_frame;
          MAX_SCANS_TO_PROCESS = MAX_SCANS_TO_PROCESS + 1) {
        this->m_comp_list[(int)MAX_SCANS_TO_PROCESS] = MAX_SCANS_TO_PROCESS;
      }
      bVar1 = calc_mcu_block_order(this);
      if (bVar1) {
        return;
      }
      stop_decoding(this,JPGD_DECODE_ERROR);
    }
    bVar1 = this->m_spectral_start != 0;
    bVar4 = this->m_successive_high != 0;
    if ((this->m_spectral_end < this->m_spectral_start) || (0x3f < this->m_spectral_end)) {
      stop_decoding(this,JPGD_BAD_SOS_SPECTRAL);
    }
    if (bVar1) {
      if (this->m_comps_in_scan != 1) {
        stop_decoding(this,JPGD_BAD_SOS_SPECTRAL);
      }
    }
    else if (this->m_spectral_end != 0) {
      stop_decoding(this,JPGD_BAD_SOS_SPECTRAL);
    }
    if ((bVar4) && (this->m_successive_low != this->m_successive_high + -1)) break;
    if (bVar1) {
      if (bVar4) {
        local_30 = decode_block_ac_refine;
      }
      else {
        local_30 = decode_block_ac_first;
      }
    }
    else if (bVar4) {
      local_30 = decode_block_dc_refine;
    }
    else {
      local_30 = decode_block_dc_first;
    }
    decode_scan(this,local_30);
    this->m_bits_left = 0x10;
    get_bits(this,0x10);
    get_bits(this,0x10);
    dc_only_scan = dc_only_scan + 1;
    if (1000 < (uint)dc_only_scan) {
      stop_decoding(this,JPGD_TOO_MANY_SCANS);
    }
  }
  stop_decoding(this,JPGD_BAD_SOS_SUCCESSIVE);
}

Assistant:

void jpeg_decoder::init_progressive()
	{
		int i;

		if (m_comps_in_frame == 4)
			stop_decoding(JPGD_UNSUPPORTED_COLORSPACE);

		// Allocate the coefficient buffers.
		for (i = 0; i < m_comps_in_frame; i++)
		{
			m_dc_coeffs[i] = coeff_buf_open(m_max_mcus_per_row * m_comp_h_samp[i], m_max_mcus_per_col * m_comp_v_samp[i], 1, 1);
			m_ac_coeffs[i] = coeff_buf_open(m_max_mcus_per_row * m_comp_h_samp[i], m_max_mcus_per_col * m_comp_v_samp[i], 8, 8);
		}

		// See https://libjpeg-turbo.org/pmwiki/uploads/About/TwoIssueswiththeJPEGStandard.pdf
		uint32_t total_scans = 0;
		const uint32_t MAX_SCANS_TO_PROCESS = 1000;

		for (; ; )
		{
			int dc_only_scan, refinement_scan;
			pDecode_block_func decode_block_func;

			if (!init_scan())
				break;

			dc_only_scan = (m_spectral_start == 0);
			refinement_scan = (m_successive_high != 0);

			if ((m_spectral_start > m_spectral_end) || (m_spectral_end > 63))
				stop_decoding(JPGD_BAD_SOS_SPECTRAL);

			if (dc_only_scan)
			{
				if (m_spectral_end)
					stop_decoding(JPGD_BAD_SOS_SPECTRAL);
			}
			else if (m_comps_in_scan != 1)  /* AC scans can only contain one component */
				stop_decoding(JPGD_BAD_SOS_SPECTRAL);

			if ((refinement_scan) && (m_successive_low != m_successive_high - 1))
				stop_decoding(JPGD_BAD_SOS_SUCCESSIVE);

			if (dc_only_scan)
			{
				if (refinement_scan)
					decode_block_func = decode_block_dc_refine;
				else
					decode_block_func = decode_block_dc_first;
			}
			else
			{
				if (refinement_scan)
					decode_block_func = decode_block_ac_refine;
				else
					decode_block_func = decode_block_ac_first;
			}

			decode_scan(decode_block_func);

			m_bits_left = 16;
			get_bits(16);
			get_bits(16);

			total_scans++;
			if (total_scans > MAX_SCANS_TO_PROCESS)
				stop_decoding(JPGD_TOO_MANY_SCANS);
		}

		m_comps_in_scan = m_comps_in_frame;

		for (i = 0; i < m_comps_in_frame; i++)
			m_comp_list[i] = i;

		if (!calc_mcu_block_order())
			stop_decoding(JPGD_DECODE_ERROR);
	}